

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O3

bool tinyusdz::tydra::detail::ExportSkelAnimation(Animation *anim,SkelAnimation *dst,string *err)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  float fVar5;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  pointer pcVar8;
  pointer paVar9;
  pointer paVar10;
  undefined8 *puVar11;
  mapped_type mVar12;
  undefined8 uVar13;
  _Base_ptr *pp_Var14;
  string *psVar15;
  byte bVar16;
  half hVar17;
  half hVar18;
  half hVar19;
  _Base_ptr p_Var20;
  mapped_type *pmVar21;
  type poVar22;
  undefined7 uVar30;
  _Base_ptr *pp_Var23;
  mapped_type *pmVar24;
  mapped_type *pmVar25;
  mapped_type *this;
  _Base_ptr p_Var26;
  mapped_type *pmVar27;
  ostream *poVar28;
  long *plVar29;
  byte bVar31;
  size_type *psVar32;
  quatf *pqVar33;
  char *pcVar34;
  byte bVar35;
  size_t sVar36;
  __hash_code __code;
  _Base_ptr p_Var37;
  _Base_ptr p_Var38;
  size_type sVar39;
  _Base_ptr p_Var40;
  _Base_ptr in_R8;
  _Base_ptr p_Var41;
  ulong uVar42;
  __hash_code __code_3;
  byte bVar43;
  pointer pqVar44;
  bool bVar45;
  __hash_code __code_1;
  long lVar46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  bool bVar47;
  Fp fp;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> static_txs;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  uint64_t joint_id;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translations;
  map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
  ts_txs;
  float tc;
  StringAndIdMap joint_idMap;
  ostringstream ss_e;
  vector<float,_std::allocator<float>_> local_498;
  Animation *local_480;
  SkelAnimation *local_478;
  _Base_ptr local_470;
  mapped_type *local_468;
  _Base_ptr local_460;
  string local_458;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_438;
  string *local_420;
  long *local_418 [2];
  long local_408 [2];
  _Base_ptr local_3f8;
  undefined1 local_3f0 [8];
  undefined1 local_3e8 [16];
  quatf local_3d8;
  float local_3c8;
  size_t local_3c0;
  __node_base_ptr ap_Stack_3b8 [2];
  _Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
  local_3a8;
  _Base_ptr local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  undefined1 local_35c [4];
  StringAndIdMap local_358;
  undefined1 local_2f8 [4];
  half hStack_2f4;
  undefined2 uStack_2f2;
  undefined2 uStack_2f0;
  undefined2 uStack_2ee;
  undefined4 uStack_2ec;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  local_2e8;
  undefined1 uStack_2e7;
  float fStack_2e6;
  ushort local_2e0;
  TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> local_2d8 [2];
  ios_base local_288 [264];
  _Base_ptr local_180;
  key_type local_178;
  key_type local_158;
  key_type local_138;
  key_type local_118;
  key_type local_f8;
  key_type local_d8;
  key_type local_b8;
  key_type local_98;
  key_type local_78;
  key_type local_58;
  unsigned_long local_38;
  
  ::std::__cxx11::string::_M_assign((string *)dst);
  value = &anim->display_name;
  if ((anim->display_name)._M_string_length != 0) {
    nonstd::optional_lite::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&(dst->meta).displayName,value);
  }
  local_480 = anim;
  local_478 = dst;
  local_420 = err;
  local_368 = value;
  if ((anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_003214c0;
  local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_358._i_to_s._M_t + 8);
  local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_358._s_to_i._M_t + 8);
  local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(anim->channels_map)._M_t._M_impl.super__Rb_tree_header;
  local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var20 != p_Var1) {
    do {
      sVar36 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        sVar36 = 0;
      }
      StringAndIdMap::add((StringAndIdMap *)(local_35c + 4),(string *)(p_Var20 + 1),sVar36);
      p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
    } while ((_Rb_tree_header *)p_Var20 != p_Var1);
  }
  sVar39 = 0;
  if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    sVar39 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
            (&local_438,sVar39,(allocator_type *)local_2f8);
  p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var20 != p_Var1) {
    do {
      uStack_2f0 = 0;
      uStack_2ee = 0;
      uStack_2ec = 0;
      local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   )0x0;
      _local_2f8 = (pointer)&local_2e8;
      ::std::__cxx11::string::_M_assign((string *)local_2f8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var20 + 1),
                 (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
      pmVar21 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::at(&local_358._s_to_i,&local_58);
      ::std::__cxx11::string::operator=
                ((string *)
                 (local_438.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start + *pmVar21),(string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (_local_2f8 != (pointer)&local_2e8) {
        operator_delete(_local_2f8,CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) + 1);
      }
      p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
    } while ((_Rb_tree_header *)p_Var20 != p_Var1);
  }
  dst = local_478;
  poVar22 = nonstd::optional_lite::
            optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                      ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
                       &(local_478->joints)._attrib,&local_438);
  p_Var20 = (local_480->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar30 = (undefined7)((ulong)poVar22 >> 8);
  if ((_Rb_tree_header *)p_Var20 == p_Var1) {
    local_370 = (_Base_ptr)CONCAT71(local_370._1_7_,1);
    local_460 = (_Base_ptr)CONCAT44(local_460._4_4_,(int)CONCAT71(uVar30,1));
LAB_0031f9d4:
    anim = local_480;
    local_3e8._0_8_ = (pointer)0x0;
    local_3e8._8_8_ = (pointer)0x0;
    local_3d8.imag._M_elems._0_8_ = (pointer)0x0;
    _local_2f8 = (pointer)0x3f8000003f800000;
    uStack_2f0 = 0;
    uStack_2ee = 0x3f80;
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
              ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)local_3e8
               ,(long)local_438.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_438.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5,(value_type *)local_2f8);
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_2d8[0]._17_8_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    _local_2f8 = (pointer)0x0;
    uStack_2f0 = 0;
    uStack_2ee = 0;
    uStack_2ec = 0;
    local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 )0x0;
    uStack_2e7 = 0;
    _fStack_2e6 = 0;
    local_2e0._0_1_ = false;
    local_2e0._1_1_ = false;
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::operator=
              ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)local_2f8
               ,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                local_3e8);
    local_2e0 = 1;
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
                 *)&(dst->translations)._attrib,
                (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)local_2f8);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
    ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
               *)local_2d8);
    if (_local_2f8 != (pointer)0x0) {
      operator_delete(_local_2f8,
                      CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
    }
    if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_3e8._0_8_,local_3d8.imag._M_elems._0_8_ - local_3e8._0_8_);
    }
  }
  else {
    local_470 = (_Base_ptr)CONCAT71(local_470._1_7_,1);
    local_460 = (_Base_ptr)CONCAT44(local_460._4_4_,(int)CONCAT71(uVar30,1));
    bVar47 = true;
    local_468 = (mapped_type *)CONCAT44(local_468._4_4_,(int)CONCAT71(uVar30,1));
    bVar16 = 1;
    local_3f8 = p_Var20;
    bVar43 = 1;
    do {
      bVar35 = bVar43;
      bVar31 = bVar16;
      p_Var26 = p_Var20[2]._M_left;
      if (p_Var26 == (_Base_ptr)0x0) {
        bVar47 = false;
        bVar45 = true;
LAB_0031f93c:
        local_468 = (mapped_type *)((ulong)local_468 & 0xffffffff00000000);
      }
      else {
        pp_Var23 = &p_Var20[2]._M_parent;
        p_Var37 = (_Base_ptr)pp_Var23;
        p_Var38 = p_Var26;
        do {
          if (0 < (int)p_Var38[1]._M_color) {
            p_Var37 = p_Var38;
          }
          p_Var38 = (&p_Var38->_M_left)[(int)p_Var38[1]._M_color < 1];
        } while (p_Var38 != (_Base_ptr)0x0);
        p_Var38 = p_Var26;
        p_Var40 = (_Base_ptr)pp_Var23;
        p_Var41 = (_Base_ptr)pp_Var23;
        if ((p_Var37 != (_Base_ptr)pp_Var23) && (p_Var41 = p_Var37, 1 < (int)p_Var37[1]._M_color)) {
          p_Var41 = (_Base_ptr)pp_Var23;
        }
        do {
          p_Var37 = p_Var38 + 1;
          if (1 < (int)p_Var37->_M_color) {
            p_Var40 = p_Var38;
          }
          pp_Var14 = &p_Var38->_M_left;
          p_Var38 = pp_Var14[(int)p_Var37->_M_color < 2];
        } while (pp_Var14[(int)p_Var37->_M_color < 2] != (_Base_ptr)0x0);
        p_Var38 = (_Base_ptr)pp_Var23;
        in_R8 = (_Base_ptr)pp_Var23;
        if ((p_Var40 != (_Base_ptr)pp_Var23) && (in_R8 = p_Var40, 2 < (int)p_Var40[1]._M_color)) {
          in_R8 = (_Base_ptr)pp_Var23;
        }
        do {
          if (2 < (int)p_Var26[1]._M_color) {
            p_Var38 = p_Var26;
          }
          p_Var26 = (&p_Var26->_M_left)[(int)p_Var26[1]._M_color < 3];
        } while (p_Var26 != (_Base_ptr)0x0);
        if (p_Var38 == (_Base_ptr)pp_Var23) {
          bVar45 = true;
        }
        else {
          bVar45 = 3 < (int)p_Var38[1]._M_color;
        }
        local_470 = (_Base_ptr)
                    CONCAT71(local_470._1_7_,(byte)local_470 & p_Var41 == (_Base_ptr)pp_Var23);
        bVar47 = (bool)(bVar47 & p_Var41 != (_Base_ptr)pp_Var23);
        if (in_R8 == (_Base_ptr)pp_Var23) goto LAB_0031f93c;
        local_460 = (_Base_ptr)((ulong)local_460 & 0xffffffff00000000);
      }
      bVar43 = bVar45 & bVar35;
      p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      bVar16 = (bVar45 ^ 1U) & bVar31;
    } while ((_Rb_tree_header *)p_Var20 != p_Var1);
    if (!bVar47 && ((ulong)local_470 & 1) == 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
      poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xf3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
      pcVar34 = 
      "translation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
      ;
      lVar46 = 0x7a;
LAB_003203b7:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,pcVar34,lVar46);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"\n",1);
      psVar15 = local_420;
      if (local_420 != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3a8);
        pqVar33 = (quatf *)(plVar29 + 2);
        if ((quatf *)*plVar29 == pqVar33) {
          local_3d8.imag._M_elems._0_8_ = *(undefined8 *)(pqVar33->imag)._M_elems;
          local_3d8._8_8_ = plVar29[3];
          local_3e8._0_8_ = &local_3d8;
        }
        else {
          local_3d8.imag._M_elems._0_8_ = *(undefined8 *)(pqVar33->imag)._M_elems;
          local_3e8._0_8_ = (quatf *)*plVar29;
        }
        local_3e8._8_8_ = plVar29[1];
        *plVar29 = (long)pqVar33;
        plVar29[1] = 0;
        *(undefined1 *)(plVar29 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar15,local_3e8._0_8_);
        if ((quatf *)local_3e8._0_8_ != &local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8.imag._M_elems._0_8_ + 1));
        }
        if ((_Base_ptr *)local_3a8._M_impl._0_8_ !=
            &local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_3a8._M_impl._0_8_,
                          (ulong)((long)&((_Rb_tree_node_base *)
                                         &(local_3a8._M_impl.super__Rb_tree_header._M_header.
                                          _M_parent)->_M_color)->_M_color + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
      ::std::ios_base::~ios_base(local_288);
LAB_00321eff:
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_438);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::_M_erase(&local_358._s_to_i._M_t,
                 (_Link_type)
                 local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_00321f29:
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_35c + 4),
                 (_Link_type)
                 local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      return false;
    }
    if ((((byte)local_468 | (byte)local_460) & 1) == 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
      poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xf7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
      pcVar34 = 
      "rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
      ;
      lVar46 = 0x77;
      goto LAB_003203b7;
    }
    if (bVar45 != false) {
      bVar31 = bVar35;
    }
    if (bVar31 == 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
      poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xfb);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
      pcVar34 = 
      "scale channel partially exists among joints. No joints have animation channel or all joints have animation channels."
      ;
      lVar46 = 0x74;
      goto LAB_003203b7;
    }
    local_370 = (_Base_ptr)CONCAT71(local_370._1_7_,bVar43);
    dst = local_478;
    if (((ulong)local_470 & 1) != 0) goto LAB_0031f9d4;
    local_3e8._0_8_ = ap_Stack_3b8;
    local_3e8._8_8_ = (pointer)0x1;
    local_3d8.imag._M_elems._0_8_ = (pointer)0x0;
    local_3d8.imag._M_elems[2] = 0.0;
    local_3d8.real = 0.0;
    local_3c8 = 1.0;
    local_3c0 = 0;
    ap_Stack_3b8[0] = (__node_base_ptr)0x0;
    p_Var20 = local_3f8[2]._M_left;
    if (p_Var20 == (_Base_ptr)0x0) {
LAB_0032067e:
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      anim = local_480;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      p_Var26 = (_Base_ptr)&local_3f8[2]._M_parent;
      do {
        if (0 < (int)p_Var20[1]._M_color) {
          p_Var26 = p_Var20;
        }
        p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < 1];
      } while (p_Var20 != (_Base_ptr)0x0);
      if (((p_Var26 == (_Base_ptr)&local_3f8[2]._M_parent) || (1 < (int)p_Var26[1]._M_color)) ||
         (p_Var20 = p_Var26[5]._M_parent, p_Var26[5]._M_left == p_Var20)) goto LAB_0032067e;
      lVar46 = 0;
      uVar42 = 0;
      do {
        local_3a8._M_impl._0_4_ = *(undefined4 *)((long)&p_Var20->_M_color + lVar46);
        _local_2f8 = (pointer)local_3e8;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_3e8,&local_3a8,local_2f8);
        dst = local_478;
        anim = local_480;
        uVar42 = uVar42 + 1;
        p_Var20 = p_Var26[5]._M_parent;
        lVar46 = lVar46 + 0x10;
      } while (uVar42 < (ulong)((long)p_Var26[5]._M_left - (long)p_Var20 >> 4));
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pointer)local_3d8.imag._M_elems._0_8_ != (pointer)0x0) {
        pqVar44 = (pointer)local_3d8.imag._M_elems._0_8_;
        do {
          fVar5 = *(float *)((long)(pqVar44->imag)._M_elems + 8);
          _local_2f8 = (pointer)0x7ff8000000000000;
          if (!NAN(fVar5)) {
            if (ABS(fVar5) == INFINITY) {
              _local_2f8 = (pointer)0xfff0000000000000;
              if (-1 < (int)fVar5) {
                _local_2f8 = (pointer)0x7ff0000000000000;
              }
            }
            else {
              _local_2f8 = (pointer)(double)fVar5;
            }
          }
          pmVar25 = ::std::
                    map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                    ::operator[]((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                                  *)&local_3a8,(key_type_conflict3 *)local_2f8);
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
                    (pmVar25,(long)local_438.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_438.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
          pqVar44 = *(pointer *)(pqVar44->imag)._M_elems;
        } while (pqVar44 != (pointer)0x0);
      }
    }
    p_Var26 = &local_3a8._M_impl.super__Rb_tree_header._M_header;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var20 == p_Var1) {
      lVar46 = 0;
    }
    else {
      do {
        local_180 = p_Var26;
        p_Var26 = p_Var20[2]._M_left;
        if (p_Var26 != (_Base_ptr)0x0) {
          p_Var38 = (_Base_ptr)&p_Var20[2]._M_parent;
          do {
            if (0 < (int)p_Var26[1]._M_color) {
              p_Var38 = p_Var26;
            }
            p_Var26 = (&p_Var26->_M_left)[(int)p_Var26[1]._M_color < 1];
          } while (p_Var26 != (_Base_ptr)0x0);
          if ((p_Var38 != (_Base_ptr)&p_Var20[2]._M_parent) && ((int)p_Var38[1]._M_color < 2)) {
            p_Var26 = p_Var38[5]._M_parent;
            local_3f8 = p_Var20 + 1;
            if (p_Var38[5]._M_left != p_Var26) {
              p_Var37 = (_Base_ptr)0x0;
              do {
                _Var3 = (&p_Var26->_M_color)[(long)p_Var37 * 4];
                puVar11 = *(undefined8 **)
                           (((float3 *)local_3e8._0_8_)->_M_elems +
                           ((ulong)_Var3 % (ulong)local_3e8._8_8_) * 2);
                local_35c = (undefined1  [4])_Var3;
                if (puVar11 == (undefined8 *)0x0) {
LAB_00321f44:
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3)
                  ;
                  poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x127);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
                  local_418[0] = local_408;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_418,
                             "All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}"
                             ,"");
                  fmt::format<float,std::__cxx11::string>
                            (&local_458,(fmt *)local_418,(string *)local_35c,(float *)local_3f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_R8);
                  poVar28 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,local_458._M_dataplus._M_p,
                                       local_458._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\n",1);
                  paVar2 = &local_458.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_458._M_dataplus._M_p != paVar2) {
                    operator_delete(local_458._M_dataplus._M_p,
                                    local_458.field_2._M_allocated_capacity + 1);
                  }
                  psVar15 = local_420;
                  if (local_418[0] != local_408) {
                    operator_delete(local_418[0],local_408[0] + 1);
                  }
                  if (psVar15 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar29 = (long *)::std::__cxx11::string::append((char *)local_418);
                    psVar32 = (size_type *)(plVar29 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar32) {
                      local_458.field_2._M_allocated_capacity = *psVar32;
                      local_458.field_2._8_8_ = plVar29[3];
                      local_458._M_dataplus._M_p = (pointer)paVar2;
                    }
                    else {
                      local_458.field_2._M_allocated_capacity = *psVar32;
                      local_458._M_dataplus._M_p = (pointer)*plVar29;
                    }
                    local_458._M_string_length = plVar29[1];
                    *plVar29 = (long)psVar32;
                    plVar29[1] = 0;
                    *(undefined1 *)(plVar29 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)psVar15,(ulong)local_458._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_458._M_dataplus._M_p != paVar2) {
                      operator_delete(local_458._M_dataplus._M_p,
                                      local_458.field_2._M_allocated_capacity + 1);
                    }
                    if (local_418[0] != local_408) {
LAB_00322273:
                      operator_delete(local_418[0],local_408[0] + 1);
                    }
                  }
LAB_00322283:
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                  ::std::ios_base::~ios_base(local_288);
                  if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_498.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_498.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  ::std::
                  _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                  ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                              *)&local_3a8,
                             (_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent
                            );
                  goto LAB_00321ef2;
                }
                in_R8 = (_Base_ptr)*puVar11;
                _Var4 = *(_Rb_tree_color *)&in_R8->_M_parent;
                while (_Var4 != _Var3) {
                  in_R8 = *(_Base_ptr *)in_R8;
                  if ((in_R8 == (_Base_ptr)0x0) ||
                     (_Var4 = *(_Rb_tree_color *)&in_R8->_M_parent,
                     (ulong)_Var4 % (ulong)local_3e8._8_8_ != (ulong)_Var3 % (ulong)local_3e8._8_8_)
                     ) goto LAB_00321f44;
                }
                local_468 = (mapped_type *)CONCAT44(local_468._4_4_,_Var3);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                local_470 = p_Var37;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_138,*(long *)(p_Var20 + 1),
                           (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
                pmVar21 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          ::at(&local_358._s_to_i,&local_138);
                pcVar8 = (pointer)*pmVar21;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
                _local_2f8 = (pointer)0x7ff8000000000000;
                if (!NAN(local_468._0_4_)) {
                  if ((_Var3 & 0x7fffffff) == 0x7f800000) {
                    _local_2f8 = (pointer)0xfff0000000000000;
                    if (-1 < (int)_Var3) {
                      _local_2f8 = (pointer)0x7ff0000000000000;
                    }
                  }
                  else {
                    _local_2f8 = (pointer)(double)local_468._0_4_;
                  }
                }
                local_3f0 = (undefined1  [8])pcVar8;
                pmVar25 = ::std::
                          map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                          ::at((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                                *)&local_3a8,(key_type_conflict3 *)local_2f8);
                paVar9 = (pmVar25->
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((pointer)(((long)(pmVar25->
                                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 2
                              ) * -0x5555555555555555) < pcVar8) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3)
                  ;
                  poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x12e);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
                  local_418[0] = local_408;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_418,
                             "Internal error. joint_id {} exceeds # of joints {}","");
                  local_38 = ((long)(pmVar25->
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pmVar25->
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555;
                  fmt::format<unsigned_long,unsigned_long>
                            (&local_458,(fmt *)local_418,(string *)local_3f0,&local_38,
                             (unsigned_long *)in_R8);
                  poVar28 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,local_458._M_dataplus._M_p,
                                       local_458._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\n",1);
                  paVar2 = &local_458.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_458._M_dataplus._M_p != paVar2) {
                    operator_delete(local_458._M_dataplus._M_p,
                                    local_458.field_2._M_allocated_capacity + 1);
                  }
                  psVar15 = local_420;
                  if (local_418[0] != local_408) {
                    operator_delete(local_418[0],local_408[0] + 1);
                  }
                  if (psVar15 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar29 = (long *)::std::__cxx11::string::append((char *)local_418);
                    psVar32 = (size_type *)(plVar29 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar32) {
                      local_458.field_2._M_allocated_capacity = *psVar32;
                      local_458.field_2._8_8_ = plVar29[3];
                      local_458._M_dataplus._M_p = (pointer)paVar2;
                    }
                    else {
                      local_458.field_2._M_allocated_capacity = *psVar32;
                      local_458._M_dataplus._M_p = (pointer)*plVar29;
                    }
                    local_458._M_string_length = plVar29[1];
                    *plVar29 = (long)psVar32;
                    plVar29[1] = 0;
                    *(undefined1 *)(plVar29 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)psVar15,(ulong)local_458._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_458._M_dataplus._M_p != paVar2) {
                      operator_delete(local_458._M_dataplus._M_p,
                                      local_458.field_2._M_allocated_capacity + 1);
                    }
                    if (local_418[0] != local_408) goto LAB_00322273;
                  }
                  goto LAB_00322283;
                }
                p_Var26 = p_Var38[5]._M_parent;
                paVar9[(long)pcVar8]._M_elems[2] =
                     *(float *)((long)&p_Var26->_M_parent + (long)p_Var37 * 0x10 + 4);
                *(undefined8 *)paVar9[(long)pcVar8]._M_elems =
                     *(undefined8 *)(&p_Var26->field_0x4 + (long)p_Var37 * 0x10);
                p_Var37 = (_Base_ptr)((long)&local_470->_M_color + 1);
                p_Var26 = p_Var38[5]._M_parent;
                dst = local_478;
              } while (p_Var37 < (_Base_ptr)((long)p_Var38[5]._M_left - (long)p_Var26 >> 4));
            }
            anim = local_480;
            if (*(char *)&p_Var38[4]._M_right == '\x01') {
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,*(long *)(p_Var20 + 1),
                         (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
              pmVar21 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::at(&local_358._s_to_i,&local_78);
              mVar12 = *pmVar21;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((ulong)(((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
                  mVar12 + 1) {
                ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                resize((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &local_498,mVar12 + 1);
              }
              if (*(char *)&p_Var38[4]._M_right == '\0') goto LAB_00322501;
              local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[mVar12 * 3 + 2] = *(float *)&p_Var38[5].field_0x4;
              *(undefined8 *)
               (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + mVar12 * 3) =
                   *(undefined8 *)((long)&p_Var38[4]._M_right + 4);
            }
          }
        }
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
        p_Var26 = local_180;
      } while ((_Rb_tree_header *)p_Var20 != p_Var1);
      lVar46 = ((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    }
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_2d8[0]._17_8_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    _local_2f8 = (pointer)0x0;
    uStack_2f0 = 0;
    uStack_2ee = 0;
    uStack_2ec = 0;
    local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 )0x0;
    uStack_2e7 = 0;
    _fStack_2e6 = 0;
    local_2e0._0_1_ = false;
    local_2e0._1_1_ = false;
    bVar47 = lVar46 == (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5;
    if (bVar47) {
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::operator=
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 local_2f8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_498);
    }
    local_2e0 = (ushort)bVar47;
    for (p_Var20 = local_3a8._M_impl.super__Rb_tree_header._M_header._M_left; p_Var20 != p_Var26;
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20)) {
      TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
      ::add_sample((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                    *)local_2d8,*(double *)(p_Var20 + 1),
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &p_Var20[1]._M_parent);
    }
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
                 *)&(dst->translations)._attrib,
                (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)local_2f8);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
    ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
               *)local_2d8);
    if (_local_2f8 != (pointer)0x0) {
      operator_delete(_local_2f8,
                      CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
    }
    if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ::std::
    _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
    ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                *)&local_3a8,(_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent
              );
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_3e8);
  }
  if (((ulong)local_460 & 1) == 0) {
    local_3e8._0_8_ = ap_Stack_3b8;
    local_3e8._8_8_ = (pointer)0x1;
    local_3d8.imag._M_elems._0_8_ = (pointer)0x0;
    local_3d8.imag._M_elems[2] = 0.0;
    local_3d8.real = 0.0;
    local_3c8 = 1.0;
    local_3c0 = 0;
    ap_Stack_3b8[0] = (__node_base_ptr)0x0;
    p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var26 = p_Var20[2]._M_left;
    if (p_Var26 == (_Base_ptr)0x0) {
LAB_0031fdce:
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      pp_Var23 = &p_Var20[2]._M_parent;
      p_Var20 = (_Base_ptr)pp_Var23;
      do {
        if (1 < (int)p_Var26[1]._M_color) {
          p_Var20 = p_Var26;
        }
        p_Var26 = (&p_Var26->_M_left)[(int)p_Var26[1]._M_color < 2];
      } while (p_Var26 != (_Base_ptr)0x0);
      if (((p_Var20 == (_Base_ptr)pp_Var23) || (2 < (int)p_Var20[1]._M_color)) ||
         (p_Var26 = *(_Base_ptr *)(p_Var20 + 7), p_Var20[7]._M_parent == p_Var26))
      goto LAB_0031fdce;
      lVar46 = 0;
      uVar42 = 0;
      do {
        local_3a8._M_impl._0_4_ = *(undefined4 *)((long)&p_Var26->_M_color + lVar46);
        _local_2f8 = (pointer)local_3e8;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_3e8,&local_3a8,local_2f8);
        dst = local_478;
        anim = local_480;
        uVar42 = uVar42 + 1;
        p_Var26 = *(_Base_ptr *)(p_Var20 + 7);
        lVar46 = lVar46 + 0x14;
      } while (uVar42 < (ulong)(((long)p_Var20[7]._M_parent - (long)p_Var26 >> 2) *
                               -0x3333333333333333));
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pointer)local_3d8.imag._M_elems._0_8_ != (pointer)0x0) {
        pqVar44 = (pointer)local_3d8.imag._M_elems._0_8_;
        do {
          fVar5 = *(float *)((long)(pqVar44->imag)._M_elems + 8);
          _local_2f8 = (pointer)0x7ff8000000000000;
          if (!NAN(fVar5)) {
            if (ABS(fVar5) == INFINITY) {
              _local_2f8 = (pointer)0xfff0000000000000;
              if (-1 < (int)fVar5) {
                _local_2f8 = (pointer)0x7ff0000000000000;
              }
            }
            else {
              _local_2f8 = (pointer)(double)fVar5;
            }
          }
          pmVar24 = ::std::
                    map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                    ::operator[]((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                  *)&local_3a8,(key_type_conflict3 *)local_2f8);
          ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::resize
                    (pmVar24,(long)local_438.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_438.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
          pqVar44 = *(pointer *)(pqVar44->imag)._M_elems;
        } while (pqVar44 != (pointer)0x0);
      }
    }
    p_Var26 = &local_3a8._M_impl.super__Rb_tree_header._M_header;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var20 == p_Var1) {
      lVar46 = 0;
    }
    else {
      do {
        local_3f8 = p_Var26;
        p_Var26 = p_Var20[2]._M_left;
        if (p_Var26 != (_Base_ptr)0x0) {
          p_Var38 = (_Base_ptr)&p_Var20[2]._M_parent;
          do {
            if (1 < (int)p_Var26[1]._M_color) {
              p_Var38 = p_Var26;
            }
            p_Var26 = (&p_Var26->_M_left)[(int)p_Var26[1]._M_color < 2];
          } while (p_Var26 != (_Base_ptr)0x0);
          if ((p_Var38 != (_Base_ptr)&p_Var20[2]._M_parent) && ((int)p_Var38[1]._M_color < 3)) {
            p_Var26 = *(_Base_ptr *)(p_Var38 + 7);
            local_460 = p_Var20 + 1;
            if (p_Var38[7]._M_parent != p_Var26) {
              uVar42 = 0;
              do {
                _Var3 = (&p_Var26->_M_color)[uVar42 * 5];
                local_3f0._0_4_ = _Var3;
                plVar29 = *(long **)(((float3 *)local_3e8._0_8_)->_M_elems +
                                    ((ulong)_Var3 % (ulong)local_3e8._8_8_) * 2);
                if (plVar29 == (long *)0x0) {
LAB_00320174:
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3)
                  ;
                  poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x171);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
                  local_418[0] = local_408;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_418,
                             "All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}"
                             ,"");
                  fmt::format<float,std::__cxx11::string>
                            (&local_458,(fmt *)local_418,(string *)local_3f0,(float *)local_460,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_R8);
                  poVar28 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,local_458._M_dataplus._M_p,
                                       local_458._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\n",1);
                  paVar2 = &local_458.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_458._M_dataplus._M_p != paVar2) {
                    operator_delete(local_458._M_dataplus._M_p,
                                    local_458.field_2._M_allocated_capacity + 1);
                  }
                  psVar15 = local_420;
                  if (local_418[0] != local_408) {
                    operator_delete(local_418[0],local_408[0] + 1);
                  }
                  if (psVar15 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar29 = (long *)::std::__cxx11::string::append((char *)local_418);
                    psVar32 = (size_type *)(plVar29 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar32) {
                      local_458.field_2._M_allocated_capacity = *psVar32;
                      local_458.field_2._8_8_ = plVar29[3];
                      local_458._M_dataplus._M_p = (pointer)paVar2;
                    }
                    else {
                      local_458.field_2._M_allocated_capacity = *psVar32;
                      local_458._M_dataplus._M_p = (pointer)*plVar29;
                    }
                    local_458._M_string_length = plVar29[1];
                    *plVar29 = (long)psVar32;
                    plVar29[1] = 0;
                    *(undefined1 *)(plVar29 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)psVar15,(ulong)local_458._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_458._M_dataplus._M_p != paVar2) {
                      operator_delete(local_458._M_dataplus._M_p,
                                      local_458.field_2._M_allocated_capacity + 1);
                    }
                    if (local_418[0] != local_408) {
                      operator_delete(local_418[0],local_408[0] + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                  ::std::ios_base::~ios_base(local_288);
                  if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_498.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_498.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  ::std::
                  _Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                  ::_M_erase(&local_3a8,
                             (_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent
                            );
                  goto LAB_00321ef2;
                }
                in_R8 = (_Base_ptr)*plVar29;
                _Var4 = *(_Rb_tree_color *)&in_R8->_M_parent;
                while (_Var4 != _Var3) {
                  in_R8 = *(_Base_ptr *)in_R8;
                  if ((in_R8 == (_Base_ptr)0x0) ||
                     (_Var4 = *(_Rb_tree_color *)&in_R8->_M_parent,
                     (ulong)_Var4 % (ulong)local_3e8._8_8_ != (ulong)_Var3 % (ulong)local_3e8._8_8_)
                     ) goto LAB_00320174;
                }
                local_470 = (_Base_ptr)CONCAT44(local_470._4_4_,_Var3);
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                local_468 = (mapped_type *)(uVar42 * 5);
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_158,*(long *)(p_Var20 + 1),
                           (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
                pmVar21 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          ::at(&local_358._s_to_i,&local_158);
                mVar12 = *pmVar21;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                _local_2f8 = (pointer)0x7ff8000000000000;
                if (!NAN(local_470._0_4_)) {
                  if ((_Var3 & 0x7fffffff) == 0x7f800000) {
                    _local_2f8 = (pointer)0xfff0000000000000;
                    if (-1 < (int)_Var3) {
                      _local_2f8 = (pointer)0x7ff0000000000000;
                    }
                  }
                  else {
                    _local_2f8 = (pointer)(double)local_470._0_4_;
                  }
                }
                pmVar24 = ::std::
                          map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                          ::at((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                *)&local_3a8,(key_type_conflict3 *)local_2f8);
                puVar11 = (undefined8 *)(*(long *)(p_Var38 + 7) + 4 + (long)local_468 * 4);
                uVar13 = puVar11[1];
                pqVar44 = (pmVar24->
                          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                          )._M_impl.super__Vector_impl_data._M_start + mVar12;
                *(undefined8 *)(pqVar44->imag)._M_elems = *puVar11;
                *(undefined8 *)((pqVar44->imag)._M_elems + 2) = uVar13;
                uVar42 = uVar42 + 1;
                p_Var26 = *(_Base_ptr *)(p_Var38 + 7);
                dst = local_478;
              } while (uVar42 < (ulong)(((long)p_Var38[7]._M_parent - (long)p_Var26 >> 2) *
                                       -0x3333333333333333));
            }
            anim = local_480;
            if (*(char *)&p_Var38[6]._M_parent == '\x01') {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,*(long *)(p_Var20 + 1),
                         (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
              pmVar21 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::at(&local_358._s_to_i,&local_98);
              mVar12 = *pmVar21;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              uVar42 = mVar12 + 1;
              if ((ulong)((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start >> 4) < uVar42) {
                ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                resize((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       &local_498,uVar42);
              }
              if (*(char *)&p_Var38[6]._M_parent == '\0') {
                pcVar34 = 
                "const value_type &nonstd::optional_lite::optional<std::array<float, 4>>::value() const [T = std::array<float, 4>]"
                ;
                goto LAB_0032252d;
              }
              uVar13 = *(undefined8 *)((long)&p_Var38[6]._M_left + 4);
              *(undefined8 *)
               (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + mVar12 * 4) =
                   *(undefined8 *)((long)&p_Var38[6]._M_parent + 4);
              *(undefined8 *)
               (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + mVar12 * 4 + 2) = uVar13;
            }
          }
        }
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
        p_Var26 = local_3f8;
      } while ((_Rb_tree_header *)p_Var20 != p_Var1);
      lVar46 = (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4;
    }
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_2d8[0]._17_8_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    _local_2f8 = (pointer)0x0;
    uStack_2f0 = 0;
    uStack_2ee = 0;
    uStack_2ec = 0;
    local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 )0x0;
    uStack_2e7 = 0;
    _fStack_2e6 = 0;
    local_2e0._0_1_ = false;
    local_2e0._1_1_ = false;
    bVar47 = lVar46 == (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5;
    if (bVar47) {
      ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
                ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 local_2f8,
                 (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 &local_498);
    }
    local_2e0 = (ushort)bVar47;
    for (p_Var20 = local_3a8._M_impl.super__Rb_tree_header._M_header._M_left; p_Var20 != p_Var26;
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20)) {
      TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
      ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    *)local_2d8,*(double *)(p_Var20 + 1),
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &p_Var20[1]._M_parent);
    }
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                 *)&(dst->rotations)._attrib,
                (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                 *)local_2f8);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
    ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
               *)local_2d8);
    if (_local_2f8 != (pointer)0x0) {
      operator_delete(_local_2f8,
                      CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
    }
    if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ::std::
    _Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
    ::_M_erase(&local_3a8,(_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_3e8);
  }
  else {
    local_3e8._0_8_ = (pointer)0x0;
    local_3e8._8_8_ = (pointer)0x0;
    local_3d8.imag._M_elems._0_8_ = (pointer)0x0;
    local_3a8._M_impl._0_8_ = (undefined1 *)0x0;
    local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0x3f80000000000000;
    ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::_M_fill_assign
              ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)local_3e8,
               (long)local_438.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_438.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)&local_3a8);
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_2d8[0]._17_8_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    _local_2f8 = (pointer)0x0;
    uStack_2f0 = 0;
    uStack_2ee = 0;
    uStack_2ec = 0;
    local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 )0x0;
    uStack_2e7 = 0;
    _fStack_2e6 = 0;
    local_2e0._0_1_ = false;
    local_2e0._1_1_ = false;
    ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
              ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)local_2f8,
               (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)local_3e8)
    ;
    local_2e0 = 1;
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                 *)&(dst->rotations)._attrib,
                (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                 *)local_2f8);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
    ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
               *)local_2d8);
    if (_local_2f8 != (pointer)0x0) {
      operator_delete(_local_2f8,
                      CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
    }
    if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_3e8._0_8_,local_3d8.imag._M_elems._0_8_ - local_3e8._0_8_);
    }
  }
  if ((char)local_370 == '\0') {
    local_3e8._0_8_ = ap_Stack_3b8;
    local_3e8._8_8_ = (pointer)0x1;
    local_3d8.imag._M_elems._0_8_ = (pointer)0x0;
    local_3d8.imag._M_elems[2] = 0.0;
    local_3d8.real = 0.0;
    local_3c8 = 1.0;
    local_3c0 = 0;
    ap_Stack_3b8[0] = (__node_base_ptr)0x0;
    p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var26 = p_Var20[2]._M_left;
    if (p_Var26 == (_Base_ptr)0x0) {
LAB_00320d7d:
      local_460 = &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left = local_460;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right = local_460;
    }
    else {
      pp_Var23 = &p_Var20[2]._M_parent;
      p_Var20 = (_Base_ptr)pp_Var23;
      do {
        if (2 < (int)p_Var26[1]._M_color) {
          p_Var20 = p_Var26;
        }
        p_Var26 = (&p_Var26->_M_left)[(int)p_Var26[1]._M_color < 3];
      } while (p_Var26 != (_Base_ptr)0x0);
      if (((p_Var20 == (_Base_ptr)pp_Var23) || (3 < (int)p_Var20[1]._M_color)) ||
         (p_Var26 = p_Var20[8]._M_left, p_Var20[8]._M_right == p_Var26)) goto LAB_00320d7d;
      lVar46 = 0;
      uVar42 = 0;
      do {
        local_3a8._M_impl._0_4_ = *(undefined4 *)((long)&p_Var26->_M_color + lVar46);
        _local_2f8 = (pointer)local_3e8;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_3e8,&local_3a8,local_2f8);
        dst = local_478;
        anim = local_480;
        uVar42 = uVar42 + 1;
        p_Var26 = p_Var20[8]._M_left;
        lVar46 = lVar46 + 0x10;
      } while (uVar42 < (ulong)((long)p_Var20[8]._M_right - (long)p_Var26 >> 4));
      local_460 = &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left = local_460;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right = local_460;
      if ((pointer)local_3d8.imag._M_elems._0_8_ != (pointer)0x0) {
        pqVar44 = (pointer)local_3d8.imag._M_elems._0_8_;
        do {
          fVar5 = *(float *)((long)(pqVar44->imag)._M_elems + 8);
          _local_2f8 = (pointer)0x7ff8000000000000;
          if (!NAN(fVar5)) {
            if (ABS(fVar5) == INFINITY) {
              _local_2f8 = (pointer)0xfff0000000000000;
              if (-1 < (int)fVar5) {
                _local_2f8 = (pointer)0x7ff0000000000000;
              }
            }
            else {
              _local_2f8 = (pointer)(double)fVar5;
            }
          }
          this = ::std::
                 map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                 ::operator[]((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                               *)&local_3a8,(key_type_conflict3 *)local_2f8);
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::resize(this,(long)local_438.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_438.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 5);
          pqVar44 = *(pointer *)(pqVar44->imag)._M_elems;
        } while (pqVar44 != (pointer)0x0);
      }
    }
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var20 == p_Var1) {
      lVar46 = 0;
    }
    else {
      do {
        p_Var26 = p_Var20[2]._M_left;
        if (p_Var26 != (_Base_ptr)0x0) {
          p_Var38 = (_Base_ptr)&p_Var20[2]._M_parent;
          do {
            if (2 < (int)p_Var26[1]._M_color) {
              p_Var38 = p_Var26;
            }
            p_Var26 = (&p_Var26->_M_left)[(int)p_Var26[1]._M_color < 3];
          } while (p_Var26 != (_Base_ptr)0x0);
          if ((p_Var38 != (_Base_ptr)&p_Var20[2]._M_parent) && ((int)p_Var38[1]._M_color < 4)) {
            p_Var26 = p_Var38[8]._M_left;
            local_3f8 = p_Var38;
            local_370 = p_Var20 + 1;
            if (p_Var38[8]._M_right != p_Var26) {
              uVar42 = 0;
LAB_00320e40:
              _Var6 = (&p_Var26->_M_color)[uVar42 * 4];
              local_3f0._0_4_ = _Var6;
              puVar11 = *(undefined8 **)
                         (((float3 *)local_3e8._0_8_)->_M_elems +
                         ((ulong)_Var6 % (ulong)local_3e8._8_8_) * 2);
              if (puVar11 != (undefined8 *)0x0) goto code_r0x00320e7f;
LAB_0032111e:
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
              poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x1bd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
              local_418[0] = local_408;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_418,
                         "All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}"
                         ,"");
              fmt::format<float,std::__cxx11::string>
                        (&local_458,(fmt *)local_418,(string *)local_3f0,(float *)local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8)
              ;
              poVar28 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,local_458._M_dataplus._M_p,
                                   local_458._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\n",1);
              paVar2 = &local_458.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_dataplus._M_p != paVar2) {
                operator_delete(local_458._M_dataplus._M_p,
                                local_458.field_2._M_allocated_capacity + 1);
              }
              psVar15 = local_420;
              if (local_418[0] != local_408) {
                operator_delete(local_418[0],local_408[0] + 1);
              }
              if (psVar15 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar29 = (long *)::std::__cxx11::string::append((char *)local_418);
                psVar32 = (size_type *)(plVar29 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar29 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar32) {
                  local_458.field_2._M_allocated_capacity = *psVar32;
                  local_458.field_2._8_8_ = plVar29[3];
                  local_458._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_458.field_2._M_allocated_capacity = *psVar32;
                  local_458._M_dataplus._M_p = (pointer)*plVar29;
                }
                local_458._M_string_length = plVar29[1];
                *plVar29 = (long)psVar32;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)psVar15,(ulong)local_458._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != paVar2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
                if (local_418[0] != local_408) {
                  operator_delete(local_418[0],local_408[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
              ::std::ios_base::~ios_base(local_288);
              if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_498.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_498.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              ::std::
              _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
              ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                          *)&local_3a8,
                         (_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_00321ef2:
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_3e8);
              goto LAB_00321eff;
            }
LAB_00321006:
            p_Var26 = local_3f8;
            if ((char)local_3f8[8]._M_color == _S_black) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,*(long *)(p_Var20 + 1),
                         (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
              pmVar21 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::at(&local_358._s_to_i,&local_b8);
              mVar12 = *pmVar21;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((ulong)(((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start >> 1) * -0x5555555555555555) <
                  mVar12 + 1) {
                ::std::
                vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          *)&local_498,mVar12 + 1);
              }
              if ((((char)p_Var26[8]._M_color == _S_red) ||
                  (hVar17 = tinyusdz::value::float_to_half_full(*(float *)&p_Var26[8].field_0x4),
                  (char)p_Var26[8]._M_color == _S_red)) ||
                 (hVar18 = tinyusdz::value::float_to_half_full(*(float *)&p_Var26[8]._M_parent),
                 (char)p_Var26[8]._M_color == _S_red)) goto LAB_00322501;
              hVar19 = tinyusdz::value::float_to_half_full
                                 (*(float *)((long)&p_Var26[8]._M_parent + 4));
              *(uint16_t *)
               ((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + mVar12 * 6) = hVar17.value;
              *(uint16_t *)
               ((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + mVar12 * 6 + 2) = hVar18.value;
              *(uint16_t *)
               ((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + mVar12 * 6 + 4) = hVar19.value;
              anim = local_480;
            }
          }
        }
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != p_Var1);
      lVar46 = ((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
      dst = local_478;
    }
    p_Var20 = local_460;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_2d8[0]._17_8_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    _local_2f8 = (pointer)0x0;
    uStack_2f0 = 0;
    uStack_2ee = 0;
    uStack_2ec = 0;
    local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 )0x0;
    uStack_2e7 = 0;
    _fStack_2e6 = 0;
    local_2e0._0_1_ = false;
    local_2e0._1_1_ = false;
    bVar47 = lVar46 == (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5;
    if (bVar47) {
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)local_2f8,
                  (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&local_498);
    }
    local_2e0 = (ushort)bVar47;
    for (p_Var26 = local_3a8._M_impl.super__Rb_tree_header._M_header._M_left; p_Var26 != p_Var20;
        p_Var26 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var26)) {
      TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::add_sample((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                    *)local_2d8,*(double *)(p_Var26 + 1),
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&p_Var26[1]._M_parent);
    }
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                 *)&(dst->scales)._attrib,
                (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 *)local_2f8);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
    ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
               *)local_2d8);
    if (_local_2f8 != (pointer)0x0) {
      operator_delete(_local_2f8,
                      CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
    }
    value = local_368;
    if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ::std::
    _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
    ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                *)&local_3a8,(_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent
              );
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_3e8);
  }
  else {
    local_3e8._0_8_ = (quatf *)0x0;
    local_3e8._8_8_ = (pointer)0x0;
    local_3d8.imag._M_elems._0_8_ = (pointer)0x0;
    lVar46 = (long)local_438.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_438.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    hVar17 = tinyusdz::value::float_to_half_full(1.0);
    _local_2f8 = (pointer)CONCAT62(stack0xfffffffffffffd0a,hVar17.value);
    hVar17 = tinyusdz::value::float_to_half_full(1.0);
    local_2f8 = (undefined1  [4])CONCAT22(hVar17.value,local_2f8._0_2_);
    hVar17 = tinyusdz::value::float_to_half_full(1.0);
    _local_2f8 = (_Type)CONCAT24(hVar17.value,local_2f8);
    ::std::
    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::_M_fill_assign((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)local_3e8,lVar46 >> 5,(value_type *)local_2f8);
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_2d8[0]._17_8_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    _local_2f8 = (pointer)0x0;
    uStack_2f0 = 0;
    uStack_2ee = 0;
    uStack_2ec = 0;
    local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 )0x0;
    uStack_2e7 = 0;
    _fStack_2e6 = 0;
    local_2e0._0_1_ = false;
    local_2e0._1_1_ = false;
    ::std::
    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 *)local_2f8,
                (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 *)local_3e8);
    local_2e0 = 1;
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                 *)&(dst->scales)._attrib,
                (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 *)local_2f8);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
    ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
               *)local_2d8);
    if (_local_2f8 != (pointer)0x0) {
      operator_delete(_local_2f8,
                      CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
    }
    value = local_368;
    if ((quatf *)local_3e8._0_8_ != (quatf *)0x0) {
      operator_delete((void *)local_3e8._0_8_,local_3d8.imag._M_elems._0_8_ - local_3e8._0_8_);
    }
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_438);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_M_erase(&local_358._s_to_i._M_t,
             (_Link_type)local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_35c + 4),
             (_Link_type)local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_003214c0:
  if ((anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    (dst->blendShapeWeights)._value_empty = true;
  }
  else {
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)((long)&local_358._i_to_s._M_t + 8);
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)((long)&local_358._s_to_i._M_t + 8);
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var20 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header;
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var20 != p_Var1) {
      do {
        sVar36 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          sVar36 = 0;
        }
        StringAndIdMap::add((StringAndIdMap *)(local_35c + 4),(string *)(p_Var20 + 1),sVar36);
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != p_Var1);
    }
    sVar39 = 0;
    if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      sVar39 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              (&local_438,sVar39,(allocator_type *)local_2f8);
    p_Var20 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var20 != p_Var1) {
      do {
        uStack_2f0 = 0;
        uStack_2ee = 0;
        uStack_2ec = 0;
        local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     )0x0;
        _local_2f8 = (pointer)&local_2e8;
        ::std::__cxx11::string::_M_assign((string *)local_2f8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,*(long *)(p_Var20 + 1),
                   (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
        pmVar21 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::at(&local_358._s_to_i,&local_d8);
        ::std::__cxx11::string::operator=
                  ((string *)
                   (local_438.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start + *pmVar21),(string *)local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (_local_2f8 != (pointer)&local_2e8) {
          operator_delete(_local_2f8,CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) + 1);
        }
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != p_Var1);
    }
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
    operator=((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
              &(local_478->blendShapes)._attrib,&local_438);
    anim = local_480;
    local_3e8._0_8_ = ap_Stack_3b8;
    local_3e8._8_8_ = (pointer)0x1;
    local_3d8.imag._M_elems._0_8_ = (pointer)0x0;
    local_3d8.imag._M_elems[2] = 0.0;
    local_3d8.real = 0.0;
    local_3c8 = 1.0;
    local_3c0 = 0;
    ap_Stack_3b8[0] = (__node_base_ptr)0x0;
    p_Var20 = (local_480->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var26 = p_Var20[2]._M_parent;
    if (p_Var20[2]._M_left == p_Var26) {
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      uVar42 = 0;
      do {
        local_3a8._M_impl._0_4_ = (&p_Var26->_M_color)[uVar42 * 2];
        _local_2f8 = (pointer)local_3e8;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_3e8,&local_3a8,local_2f8);
        uVar42 = uVar42 + 1;
        p_Var26 = p_Var20[2]._M_parent;
      } while (uVar42 < (ulong)((long)p_Var20[2]._M_left - (long)p_Var26 >> 3));
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pointer)local_3d8.imag._M_elems._0_8_ != (pointer)0x0) {
        pqVar44 = (pointer)local_3d8.imag._M_elems._0_8_;
        do {
          fVar5 = *(float *)((long)(pqVar44->imag)._M_elems + 8);
          _local_2f8 = (pointer)0x7ff8000000000000;
          if (!NAN(fVar5)) {
            if (ABS(fVar5) == INFINITY) {
              _local_2f8 = (pointer)0xfff0000000000000;
              if (-1 < (int)fVar5) {
                _local_2f8 = (pointer)0x7ff0000000000000;
              }
            }
            else {
              _local_2f8 = (pointer)(double)fVar5;
            }
          }
          pmVar27 = ::std::
                    map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)&local_3a8,(key_type_conflict3 *)local_2f8);
          ::std::vector<float,_std::allocator<float>_>::resize
                    (pmVar27,(long)local_438.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_438.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
          pqVar44 = *(pointer *)(pqVar44->imag)._M_elems;
        } while (pqVar44 != (pointer)0x0);
      }
    }
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    p_Var20 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var20 == p_Var1) {
      lVar46 = 0;
    }
    else {
      do {
        p_Var26 = p_Var20[2]._M_parent;
        if (p_Var20[2]._M_left != p_Var26) {
          local_470 = p_Var20 + 1;
          uVar42 = 0;
          do {
            _Var6 = (&p_Var26->_M_color)[uVar42 * 2];
            local_3f0._0_4_ = _Var6;
            puVar11 = *(undefined8 **)
                       (((float3 *)local_3e8._0_8_)->_M_elems +
                       ((ulong)_Var6 % (ulong)local_3e8._8_8_) * 2);
            if (puVar11 == (undefined8 *)0x0) {
LAB_00321a69:
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
              poVar28 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x206);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
              local_418[0] = local_408;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_418,
                         "All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}"
                         ,"");
              fmt::format<float,std::__cxx11::string>
                        (&local_458,(fmt *)local_418,(string *)local_3f0,(float *)local_470,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8)
              ;
              poVar28 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,local_458._M_dataplus._M_p,
                                   local_458._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\n",1);
              paVar2 = &local_458.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_dataplus._M_p != paVar2) {
                operator_delete(local_458._M_dataplus._M_p,
                                local_458.field_2._M_allocated_capacity + 1);
              }
              psVar15 = local_420;
              if (local_418[0] != local_408) {
                operator_delete(local_418[0],local_408[0] + 1);
              }
              if (psVar15 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar29 = (long *)::std::__cxx11::string::append((char *)local_418);
                psVar32 = (size_type *)(plVar29 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar29 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar32) {
                  local_458.field_2._M_allocated_capacity = *psVar32;
                  local_458.field_2._8_8_ = plVar29[3];
                  local_458._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_458.field_2._M_allocated_capacity = *psVar32;
                  local_458._M_dataplus._M_p = (pointer)*plVar29;
                }
                local_458._M_string_length = plVar29[1];
                *plVar29 = (long)psVar32;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)psVar15,(ulong)local_458._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != paVar2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
                if (local_418[0] != local_408) {
                  operator_delete(local_418[0],local_408[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
              ::std::ios_base::~ios_base(local_288);
              if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_498.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_498.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              ::std::
              _Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
              ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)&local_3a8,
                         (_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent);
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_3e8);
              ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_438);
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::_M_erase(&local_358._s_to_i._M_t,
                         (_Link_type)
                         local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
              goto LAB_00321f29;
            }
            in_R8 = (_Base_ptr)*puVar11;
            _Var7 = *(_Rb_tree_color *)&in_R8->_M_parent;
            while (_Var7 != _Var6) {
              in_R8 = *(_Base_ptr *)in_R8;
              if ((in_R8 == (_Base_ptr)0x0) ||
                 (_Var7 = *(_Rb_tree_color *)&in_R8->_M_parent,
                 (ulong)_Var7 % (ulong)local_3e8._8_8_ != (ulong)_Var6 % (ulong)local_3e8._8_8_))
              goto LAB_00321a69;
            }
            local_468 = (mapped_type *)CONCAT44(local_468._4_4_,_Var6);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,*(long *)(p_Var20 + 1),
                       (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
            pmVar21 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::at(&local_358._s_to_i,&local_f8);
            mVar12 = *pmVar21;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            _local_2f8 = (pointer)0x7ff8000000000000;
            if (!NAN(local_468._0_4_)) {
              if ((_Var6 & 0x7fffffff) == 0x7f800000) {
                _local_2f8 = (pointer)0xfff0000000000000;
                if (-1 < (int)_Var6) {
                  _local_2f8 = (pointer)0x7ff0000000000000;
                }
              }
              else {
                _local_2f8 = (pointer)(double)local_468._0_4_;
              }
            }
            pmVar27 = ::std::
                      map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                      ::at((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                            *)&local_3a8,(key_type_conflict3 *)local_2f8);
            p_Var26 = p_Var20[2]._M_parent;
            (pmVar27->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start[mVar12] = *(float *)(&p_Var26->field_0x4 + uVar42 * 8);
            uVar42 = uVar42 + 1;
          } while (uVar42 < (ulong)((long)p_Var20[2]._M_left - (long)p_Var26 >> 3));
        }
        anim = local_480;
        if ((char)p_Var20[2]._M_color == _S_black) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,*(long *)(p_Var20 + 1),
                     (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
          pmVar21 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::at(&local_358._s_to_i,&local_118);
          mVar12 = *pmVar21;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          uVar42 = mVar12 + 1;
          if ((ulong)((long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) < uVar42) {
            ::std::vector<float,_std::allocator<float>_>::resize(&local_498,uVar42);
          }
          if ((char)p_Var20[2]._M_color == _S_red) {
            pcVar34 = 
            "const value_type &nonstd::optional_lite::optional<float>::value() const [T = float]";
            goto LAB_0032252d;
          }
          local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[mVar12] = *(float *)&p_Var20[2].field_0x4;
        }
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != p_Var1);
      lVar46 = (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    }
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_2d8[0]._17_8_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_2d8[0]._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    _local_2f8 = (pointer)0x0;
    uStack_2f0 = 0;
    uStack_2ee = 0;
    uStack_2ec = 0;
    local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 )0x0;
    uStack_2e7 = 0;
    _fStack_2e6 = 0;
    local_2e0._0_1_ = false;
    local_2e0._1_1_ = false;
    bVar47 = lVar46 == (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_438.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5;
    if (bVar47) {
      ::std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)local_2f8,&local_498);
    }
    local_2e0 = (ushort)bVar47;
    dst = local_478;
    p_Var20 = local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
    while (local_478 = dst, (_Rb_tree_header *)p_Var20 != &local_3a8._M_impl.super__Rb_tree_header)
    {
      TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::add_sample
                (local_2d8,*(double *)(p_Var20 + 1),
                 (vector<float,_std::allocator<float>_> *)&p_Var20[1]._M_parent);
      p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      dst = local_478;
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<float,std::allocator<float>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<float,std::allocator<float>>>> *)
                &(dst->blendShapeWeights)._attrib,
                (Animatable<std::vector<float,_std::allocator<float>_>_> *)local_2f8);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
    ::~vector(&local_2d8[0]._samples);
    if (_local_2f8 != (pointer)0x0) {
      operator_delete(_local_2f8,
                      CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
    }
    value = local_368;
    if (local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ::std::
    _Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)&local_3a8,(_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent
              );
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_3e8);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_438);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_erase(&local_358._s_to_i._M_t,
               (_Link_type)local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
    ;
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_35c + 4),
               (_Link_type)local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
    ;
  }
  ::std::__cxx11::string::_M_assign((string *)dst);
  if ((anim->display_name)._M_string_length != 0) {
    nonstd::optional_lite::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&(dst->meta).displayName,value);
  }
  return true;
code_r0x00320e7f:
  in_R8 = (_Base_ptr)*puVar11;
  _Var7 = *(_Rb_tree_color *)&in_R8->_M_parent;
  while (_Var7 != _Var6) {
    in_R8 = *(_Base_ptr *)in_R8;
    if ((in_R8 == (_Base_ptr)0x0) ||
       (_Var7 = *(_Rb_tree_color *)&in_R8->_M_parent,
       (ulong)_Var7 % (ulong)local_3e8._8_8_ != (ulong)_Var6 % (ulong)local_3e8._8_8_))
    goto LAB_0032111e;
  }
  local_468 = (mapped_type *)CONCAT44(local_468._4_4_,_Var6);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,*(long *)(p_Var20 + 1),
             (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
  pmVar21 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::at(&local_358._s_to_i,&local_178);
  local_470 = (_Base_ptr)*pmVar21;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  _local_2f8 = (pointer)0x7ff8000000000000;
  if (!NAN(local_468._0_4_)) {
    if ((_Var6 & 0x7fffffff) == 0x7f800000) {
      _local_2f8 = (pointer)0xfff0000000000000;
      if (-1 < (int)_Var6) {
        _local_2f8 = (pointer)0x7ff0000000000000;
      }
    }
    else {
      _local_2f8 = (pointer)(double)local_468._0_4_;
    }
  }
  local_468 = ::std::
              map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
              ::at((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                    *)&local_3a8,(key_type_conflict3 *)local_2f8);
  hVar17 = tinyusdz::value::float_to_half_full
                     (*(float *)(&(p_Var38[8]._M_left)->field_0x4 + uVar42 * 0x10));
  hVar18 = tinyusdz::value::float_to_half_full
                     (*(float *)(&(p_Var38[8]._M_left)->_M_parent + uVar42 * 2));
  hVar19 = tinyusdz::value::float_to_half_full
                     (*(float *)((long)&(p_Var38[8]._M_left)->_M_parent + uVar42 * 0x10 + 4));
  paVar10 = (local_468->
            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  paVar10[(long)local_470]._M_elems[0].value = hVar17.value;
  paVar10[(long)local_470]._M_elems[1].value = hVar18.value;
  paVar10[(long)local_470]._M_elems[2].value = hVar19.value;
  uVar42 = uVar42 + 1;
  p_Var26 = p_Var38[8]._M_left;
  anim = local_480;
  if ((ulong)((long)p_Var38[8]._M_right - (long)p_Var26 >> 4) <= uVar42) goto LAB_00321006;
  goto LAB_00320e40;
LAB_00322501:
  pcVar34 = 
  "const value_type &nonstd::optional_lite::optional<std::array<float, 3>>::value() const [T = std::array<float, 3>]"
  ;
LAB_0032252d:
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x584,pcVar34);
}

Assistant:

static bool ExportSkelAnimation(const Animation &anim, SkelAnimation *dst, std::string *err) {
  (void)err;
  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }

  auto float_to_uint = [](const float x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.f = x;
 
    return fp.u;
  };

  auto uint_to_float = [](const uint32_t x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.u = x;
 
    return fp.f;
  };

  // inf and nan(TimeCode::Default) aware upcast
  auto float_to_double = [](const float x) {
    if (std::isnan(x)) {
      return value::TimeCode::Default();
    }
    if (std::isinf(x)) {
      if (std::signbit(x)) {
        return -std::numeric_limits<double>::infinity();
      } else {
        return std::numeric_limits<double>::infinity();
      }
    }
    return double(x);
  };

  if (anim.channels_map.size()) {

    StringAndIdMap joint_idMap;
    for (const auto &channels : anim.channels_map)
    {
      uint64_t joint_id = uint64_t(joint_idMap.size());
      joint_idMap.add(channels.first, uint64_t(joint_id));
    }

    std::vector<value::token> joints(joint_idMap.size());
    for (const auto &channels : anim.channels_map) {
      joints[size_t(joint_idMap.at(channels.first))] = value::token(channels.first);
    }
    dst->joints = joints;

    bool no_tx_channel{true};
    bool no_rot_channel{true};
    bool no_scale_channel{true};

    bool all_joints_has_tx_channel{true};
    bool all_joints_has_rot_channel{true};
    bool all_joints_has_scale_channel{true};

    for (const auto &channels : anim.channels_map) {

      bool has_tx_channel;
      bool has_rot_channel;
      bool has_scale_channel;

      has_tx_channel = channels.second.count(AnimationChannel::ChannelType::Translation);
      has_rot_channel = channels.second.count(AnimationChannel::ChannelType::Rotation);
      has_scale_channel = channels.second.count(AnimationChannel::ChannelType::Scale);

      if (has_tx_channel) {
        no_tx_channel = false;
      } else {
        all_joints_has_tx_channel = false;
      }

      if (has_rot_channel) {
        no_rot_channel = false;
      } else {
        all_joints_has_rot_channel = false;
      }

      if (has_scale_channel) {
        no_scale_channel = false;
      } else {
        all_joints_has_scale_channel = false;
      }
    }

    if (!no_tx_channel && !all_joints_has_tx_channel) {
      PUSH_ERROR_AND_RETURN("translation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_rot_channel && !all_joints_has_rot_channel) {
      PUSH_ERROR_AND_RETURN("rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_scale_channel && !all_joints_has_scale_channel) {
      PUSH_ERROR_AND_RETURN("scale channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (no_tx_channel) {
      // Author static(default) value.
      std::vector<value::float3> translations;
      translations.assign(joints.size(), {1.0f, 1.0f, 1.0f});
      
      dst->translations.set_value(translations);
    } else {

      // All joints should have same timeCode.
      // First collect timeCodes for the first joint.
      //
      // when timeCode is NaN(value::TimeCode::Default), the behavior(key compare in unordered_set) is undefined,
      // so use byte representation.
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &tx_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(tx_it->second.translations.samples[t].t));
          }
        }
      }

      // key: timeCode. value: values for each joints.
      std::map<double, std::vector<value::float3>> ts_txs;
      for (const auto &tc : timeCodes) {
        ts_txs[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::float3> static_txs;

      // Pack channel values
      for (const auto &channels : anim.channels_map) {

        const auto &tx_it = channels.second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != channels.second.end()) {

          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            float tc = tx_it->second.translations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::float3> &txs = ts_txs.at(float_to_double(tc));
            // just in case
            if (joint_id > txs.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Internal error. joint_id {} exceeds # of joints {}", joint_id, txs.size()));
            }
            txs[size_t(joint_id)] = tx_it->second.translations.samples[t].value;
          }

          if (tx_it->second.translations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_txs.size()) {
              static_txs.resize(size_t(joint_id+1));
            }
            static_txs[size_t(joint_id)] = tx_it->second.translations.static_value.value(); 
          }
        }
      }

      Animatable<std::vector<value::float3>> aval;
      if (static_txs.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_txs);
      }

      for (const auto &s : ts_txs) {
        aval.add_sample(s.first, s.second);
      } 

      dst->translations.set_value(aval);
    }

    if (no_rot_channel) {
      // Author static(default) value.
      std::vector<value::quatf> rots;
      value::quatf q;
      q.imag = {0.0f, 0.0f, 0.0f};
      q.real = 1.0f;
      rots.assign(joints.size(), q);

      dst->rotations.set_value(rots);
      
    } else {

      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &rot_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(rot_it->second.rotations.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::quatf>> ts_rots;
      for (const auto &tc : timeCodes) {
        ts_rots[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::quatf> static_rots;

      for (const auto &channels : anim.channels_map) {

        const auto &rot_it = channels.second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != channels.second.end()) {

          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            float tc = rot_it->second.rotations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::quatf> &rots = ts_rots.at(float_to_double(tc));
            value::quatf v;
            v[0] = rot_it->second.rotations.samples[t].value[0];
            v[1] = rot_it->second.rotations.samples[t].value[1];
            v[2] = rot_it->second.rotations.samples[t].value[2];
            v[3] = rot_it->second.rotations.samples[t].value[3];
            rots[size_t(joint_id)] = v;
          }

          if (rot_it->second.rotations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_rots.size()) {
              static_rots.resize(size_t(joint_id+1));
            }
            value::quatf v;
            v[0] = rot_it->second.rotations.static_value.value()[0];
            v[1] = rot_it->second.rotations.static_value.value()[1];
            v[2] = rot_it->second.rotations.static_value.value()[2];
            v[3] = rot_it->second.rotations.static_value.value()[3];
            static_rots[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::quatf>> aval;
      if (static_rots.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_rots);
      }

      for (const auto &s : ts_rots) {
        aval.add_sample(s.first, s.second);
      } 

      dst->rotations.set_value(aval);
    }

    if (no_scale_channel) {
      // Author static(default) value.
      std::vector<value::half3> scales;
      scales.assign(joints.size(), {value::float_to_half_full(1.0f), value::float_to_half_full(1.0f), value::float_to_half_full(1.0f)});

      dst->scales.set_value(scales);
      
    } else {
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &scale_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            timeCodes.insert(float_to_uint(scale_it->second.scales.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::half3>> ts_scales;
      for (const auto &tc : timeCodes) {
        ts_scales[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::half3> static_scales;

      for (const auto &channels : anim.channels_map) {

        const auto &scale_it = channels.second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != channels.second.end()) {

          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            float tc = scale_it->second.scales.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::half3> &scales = ts_scales.at(float_to_double(tc));
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.samples[t].value[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.samples[t].value[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.samples[t].value[2]);
            scales[size_t(joint_id)] = v;
          }

          if (scale_it->second.scales.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_scales.size()) {
              static_scales.resize(size_t(joint_id+1));
            }
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.static_value.value()[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.static_value.value()[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.static_value.value()[2]);
            static_scales[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::half3>> aval;
      if (static_scales.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_scales);
      }

      for (const auto &s : ts_scales) {
        aval.add_sample(s.first, s.second);
      } 

      dst->scales.set_value(aval);
    }
  }

  if (anim.blendshape_weights_map.size()) {
    StringAndIdMap target_idMap;
    for (const auto &target : anim.blendshape_weights_map)
    {
      uint64_t target_id = uint64_t(target_idMap.size());
      target_idMap.add(target.first, uint64_t(target_id));
    }

    std::vector<value::token> blendShapes(target_idMap.size());
    for (const auto &target : anim.blendshape_weights_map) {
      blendShapes[size_t(target_idMap.at(target.first))] = value::token(target.first);
    }
    dst->blendShapes = blendShapes;

    std::unordered_set<uint32_t> timeCodes;
    {
      const auto &weights_it = anim.blendshape_weights_map.cbegin();
      for (size_t t = 0; t < weights_it->second.samples.size(); t++) {
        timeCodes.insert(float_to_uint(weights_it->second.samples[t].t));
      }
    }

    std::map<double, std::vector<float>> ts_weights;
    for (const auto &tc : timeCodes) {
      ts_weights[float_to_double(uint_to_float(tc))].resize(blendShapes.size()); 
    }
    std::vector<float> static_weights;

    for (const auto &target : anim.blendshape_weights_map) {

      for (size_t t = 0; t < target.second.samples.size(); t++) {
        float tc = target.second.samples[t].t;
        if (!timeCodes.count(float_to_uint(tc))) {
          PUSH_ERROR_AND_RETURN(fmt::format("All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}", tc, target.first));
        }
        uint64_t target_id = target_idMap.at(target.first);

        std::vector<float> &weights = ts_weights.at(float_to_double(tc));
        //DCOUT("weights.size " << weights.size() << ", target_id " << target_id);
        weights[size_t(target_id)] = target.second.samples[t].value;
      }

      if (target.second.static_value) {
        uint64_t target_id = target_idMap.at(target.first);
        if ((target_id +1) > static_weights.size()) {
          static_weights.resize(size_t(target_id+1));
        }
        static_weights[size_t(target_id)] = target.second.static_value.value(); 
      }
    }

    Animatable<std::vector<float>> aval;
    if (static_weights.size() == blendShapes.size()) {
      // Author static(default) value.
      aval.set_default(static_weights);
    }

    for (const auto &s : ts_weights) {
      aval.add_sample(s.first, s.second);
    } 

    dst->blendShapeWeights.set_value(aval);
  } else {
    // Just author 'blendShapeWeights' without value.
    dst->blendShapeWeights.set_value_empty();
  }

  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }
  return true;
}